

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall Engine::checkMemoryUsage(Engine *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  fprintf(_stderr,"%d int vars, %d sat vars, %d propagators\n",(ulong)(this->vars).sz,
          (ulong)sat.assigns.sz,(ulong)(this->propagators).sz);
  fprintf(_stderr,"%.2fMb memory usage\n",0);
  fprintf(_stderr,"Size of IntVars: %d %d %d\n",0x60,0x78,0xb0);
  fprintf(_stderr,"Size of Propagator: %d\n",0x18);
  fprintf(_stderr,"%lld bytes used by vars\n",(ulong)(this->vars).sz * 0xb0);
  fprintf(_stderr,"%lld bytes used by propagators\n",(ulong)(this->propagators).sz * 0x18);
  lVar1 = 0;
  for (uVar2 = 0; sat.clauses.sz != uVar2; uVar2 = uVar2 + 1) {
    lVar1 = lVar1 + (ulong)(*(uint *)sat.clauses.data[uVar2] >> 8) * 4;
  }
  fprintf(_stderr,"%lld bytes used by sat clauses\n",lVar1);
  return;
}

Assistant:

void Engine::checkMemoryUsage() {
	fprintf(stderr, "%d int vars, %d sat vars, %d propagators\n", vars.size(), sat.nVars(),
					propagators.size());
	fprintf(stderr, "%.2fMb memory usage\n", memUsed());

	fprintf(stderr, "Size of IntVars: %d %d %d\n", static_cast<int>(sizeof(IntVar)),
					static_cast<int>(sizeof(IntVarEL)), static_cast<int>(sizeof(IntVarLL)));
	fprintf(stderr, "Size of Propagator: %d\n", static_cast<int>(sizeof(Propagator)));

	long long var_mem = 0;
	for (unsigned int i = 0; i < vars.size(); i++) {
		var_mem += sizeof(IntVarLL);
		/*
				var_mem += vars[i]->sz;
				if (vars[i]->getType() == INT_VAR_LL) {
					var_mem += 24 * ((IntVarLL*) vars[i])->ld.size();
				}
		*/
	}
	fprintf(stderr, "%lld bytes used by vars\n", var_mem);

	long long prop_mem = 0;
	for (unsigned int i = 0; i < propagators.size(); i++) {
		prop_mem += sizeof(*propagators[i]);
	}
	fprintf(stderr, "%lld bytes used by propagators\n", prop_mem);
	/*
		long long var_range_sum = 0;
		for (int i = 0; i < vars.size(); i++) {
			var_range_sum += vars[i]->max - vars[i]->min;
		}
		fprintf(stderr, "%lld range sum in vars\n", var_range_sum);
	*/
	long long clause_mem = 0;
	for (unsigned int i = 0; i < sat.clauses.size(); i++) {
		clause_mem += sizeof(Lit) * sat.clauses[i]->size();
	}
	fprintf(stderr, "%lld bytes used by sat clauses\n", clause_mem);
	/*
		int constants, hundred, thousand, large;
		constants = hundred = thousand = large = 0;
		for (int i = 0; i < vars.size(); i++) {
			int sz = vars[i]->max - vars[i]->min;
			if (sz == 0) constants++;
			else if (sz <= 100) hundred++;
			else if (sz <= 1000) thousand++;
			else large++;
		}
		fprintf(stderr, "Int sizes: %d %d %d %d\n", constants, hundred, thousand, large);
	*/
}